

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score.c
# Opt level: O2

void enter_score(player *p,time_t *death_time)

{
  _Bool _Var1;
  int iVar2;
  ang_file *f;
  ang_file *f_00;
  char *pcVar3;
  size_t n;
  long lVar4;
  high_score entry;
  char local_4158 [1024];
  char cur_name [1024];
  char old_name [1024];
  char new_name [1024];
  high_score scores [100];
  
  for (lVar4 = 0; lVar4 != 0x2d; lVar4 = lVar4 + 1) {
    iVar2 = option_type((int)lVar4);
    if ((iVar2 == 3) && ((p->opts).opt[lVar4] == true)) {
      pcVar3 = "Score not registered for cheaters.";
      goto LAB_001ab499;
    }
  }
  if ((p->noscore & 10) == 0) {
    if ((p->noscore & 0x20) == 0) {
      if (p->total_winner != 0) {
LAB_001ab3bf:
        build_score(&entry,p,p->died_from,death_time);
        highscore_read(scores,100);
        highscore_add(&entry,scores,100);
        path_build(old_name,0x400,ANGBAND_DIR_SCORES,"scores.old");
        path_build(cur_name,0x400,ANGBAND_DIR_SCORES,"scores.raw");
        path_build(new_name,0x400,ANGBAND_DIR_SCORES,"scores.new");
        path_build(local_4158,0x400,ANGBAND_DIR_SCORES,"scores.lok");
        for (n = 0; (n != 0x3138 && (scores[0].what[n] != '\0')); n = n + 0x7e) {
        }
        safe_setuid_grab();
        _Var1 = file_exists(local_4158);
        safe_setuid_drop();
        if (_Var1) {
          pcVar3 = "Lock file in place for scorefile; not writing.";
        }
        else {
          safe_setuid_grab();
          f = file_open(local_4158,MODE_WRITE,FTYPE_RAW);
          if (f != (ang_file *)0x0) {
            file_lock(f);
            safe_setuid_drop();
            safe_setuid_grab();
            f_00 = file_open(new_name,MODE_WRITE,FTYPE_RAW);
            safe_setuid_drop();
            if (f_00 == (ang_file *)0x0) {
              msg("Failed to open new scorefile for writing.");
              file_close(f);
              safe_setuid_grab();
            }
            else {
              file_write(f_00,scores[0].what,n);
              file_close(f_00);
              safe_setuid_grab();
              _Var1 = file_exists(old_name);
              if ((_Var1) && (_Var1 = file_delete(old_name), !_Var1)) {
                msg("Couldn\'t delete old scorefile");
              }
              _Var1 = file_exists(cur_name);
              if ((_Var1) && (_Var1 = file_move(cur_name,old_name), !_Var1)) {
                msg("Couldn\'t move old scores.raw out of the way");
              }
              _Var1 = file_move(new_name,cur_name);
              if (!_Var1) {
                msg("Couldn\'t rename new scorefile to scores.raw");
              }
              file_close(f);
            }
            file_delete(local_4158);
            safe_setuid_drop();
            return;
          }
          safe_setuid_drop();
          pcVar3 = "Failed to create lock for scorefile; not writing.";
        }
        msg(pcVar3);
        return;
      }
      iVar2 = strcmp(p->died_from,"Interrupting");
      if (iVar2 == 0) {
        pcVar3 = "Score not registered due to interruption.";
      }
      else {
        iVar2 = strcmp(p->died_from,"Retiring");
        if (iVar2 != 0) goto LAB_001ab3bf;
        pcVar3 = "Score not registered due to retiring.";
      }
    }
    else {
      pcVar3 = "Score not registered for borgs.";
    }
  }
  else {
    pcVar3 = "Score not registered for wizards.";
  }
LAB_001ab499:
  msg(pcVar3);
  event_signal(EVENT_MESSAGE_FLUSH);
  return;
}

Assistant:

void enter_score(const struct player *p, const time_t *death_time)
{
	int j;

	/* Cheaters are not scored */
	for (j = 0; j < OPT_MAX; ++j) {
		if (option_type(j) != OP_SCORE)
			continue;
		if (!p->opts.opt[j])
			continue;

		msg("Score not registered for cheaters.");
		event_signal(EVENT_MESSAGE_FLUSH);
		return;
	}

	/* Add a new entry, if allowed */
	if (p->noscore & (NOSCORE_WIZARD | NOSCORE_DEBUG)) {
		msg("Score not registered for wizards.");
		event_signal(EVENT_MESSAGE_FLUSH);
#ifdef ALLOW_BORG
#ifndef SCORE_BORGS
	}	else if (p->noscore & (NOSCORE_BORG)) {
		msg("Score not registered for borgs.");
		event_signal(EVENT_MESSAGE_FLUSH);
#endif
#endif
	} else if (!p->total_winner && streq(p->died_from, "Interrupting")) {
		msg("Score not registered due to interruption.");
		event_signal(EVENT_MESSAGE_FLUSH);
	} else if (!p->total_winner && streq(p->died_from, "Retiring")) {
		msg("Score not registered due to retiring.");
		event_signal(EVENT_MESSAGE_FLUSH);
	} else {
		struct high_score entry;
		struct high_score scores[MAX_HISCORES];

		build_score(&entry, p, p->died_from, death_time);

		highscore_read(scores, N_ELEMENTS(scores));
		highscore_add(&entry, scores, N_ELEMENTS(scores));
		highscore_write(scores, N_ELEMENTS(scores));
	}

	/* Success */
	return;
}